

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

uint8_t av1_selectSamples(MV *mv,int *pts,int *pts_inref,int len,BLOCK_SIZE bsize)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  undefined7 in_register_00000081;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  uVar5 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar2 = block_size_high[uVar5];
  if (block_size_high[uVar5] < block_size_wide[uVar5]) {
    bVar2 = block_size_wide[uVar5];
  }
  uVar7 = 0x70;
  if (bVar2 < 0x70) {
    uVar7 = (uint)bVar2;
  }
  uVar4 = 0x10;
  if (0xf < bVar2) {
    uVar4 = uVar7;
  }
  if (len < 1) {
    bVar2 = 0;
  }
  else {
    uVar8 = 0;
    uVar5 = 0;
    do {
      iVar10 = pts_inref[uVar8 * 2] - ((int)mv->col + pts[uVar8 * 2]);
      iVar1 = -iVar10;
      if (0 < iVar10) {
        iVar1 = iVar10;
      }
      iVar6 = pts_inref[uVar8 * 2 + 1] - ((int)mv->row + pts[uVar8 * 2 + 1]);
      iVar10 = -iVar6;
      if (0 < iVar6) {
        iVar10 = iVar6;
      }
      if ((uint)(iVar10 + iVar1) <= uVar4) {
        if (uVar8 != uVar5) {
          uVar9 = (ulong)(uint)((int)uVar5 << 3);
          *(undefined8 *)((long)pts + uVar9) = *(undefined8 *)(pts + uVar8 * 2);
          *(undefined8 *)((long)pts_inref + uVar9) = *(undefined8 *)(pts_inref + uVar8 * 2);
        }
        uVar5 = (ulong)(byte)((char)uVar5 + 1);
      }
      bVar2 = (byte)uVar5;
      uVar8 = uVar8 + 1;
    } while ((uint)len != uVar8);
  }
  bVar3 = 1;
  if (1 < bVar2) {
    bVar3 = bVar2;
  }
  return bVar3;
}

Assistant:

uint8_t av1_selectSamples(MV *mv, int *pts, int *pts_inref, int len,
                          BLOCK_SIZE bsize) {
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int thresh = clamp(AOMMAX(bw, bh), 16, 112);
  uint8_t ret = 0;
  assert(len <= LEAST_SQUARES_SAMPLES_MAX);

  // Only keep the samples with MV differences within threshold.
  for (int i = 0; i < len; ++i) {
    const int diff = abs(pts_inref[2 * i] - pts[2 * i] - mv->col) +
                     abs(pts_inref[2 * i + 1] - pts[2 * i + 1] - mv->row);
    if (diff > thresh) continue;
    if (ret != i) {
      memcpy(pts + 2 * ret, pts + 2 * i, 2 * sizeof(pts[0]));
      memcpy(pts_inref + 2 * ret, pts_inref + 2 * i, 2 * sizeof(pts_inref[0]));
    }
    ++ret;
  }
  // Keep at least 1 sample.
  return AOMMAX(ret, 1);
}